

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

HelicsTime helicsFederateRequestTime(HelicsFederate fed,HelicsTime requestTime,HelicsError *err)

{
  Federate *this;
  Time TVar1;
  HelicsTime HVar2;
  
  this = getFed(fed,err);
  if (this == (Federate *)0x0) {
    HVar2 = -1.785e+39;
  }
  else {
    if (requestTime <= -9223372036.854765) {
      TVar1.internalTimeCode = -0x7fffffffffffffff;
    }
    else {
      TVar1.internalTimeCode = 0x7fffffffffffffff;
      if (requestTime < 9223372036.854765) {
        TVar1.internalTimeCode =
             (baseType)
             (requestTime * 1000000000.0 +
             *(double *)(&DAT_004366c0 + (ulong)(0.0 <= requestTime * 1000000000.0) * 8));
      }
    }
    TVar1 = helics::Federate::requestTime(this,TVar1);
    if (TVar1.internalTimeCode == 0x7fffffffffffffff) {
      HVar2 = 9223372036.854774;
    }
    else {
      HVar2 = (double)(TVar1.internalTimeCode % 1000000000) * 1e-09 +
              (double)(TVar1.internalTimeCode / 1000000000);
    }
  }
  return HVar2;
}

Assistant:

HelicsTime helicsFederateRequestTime(HelicsFederate fed, HelicsTime requestTime, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto timeret = fedObj->requestTime(requestTime);
        return (timeret < helics::Time::maxVal()) ? static_cast<double>(timeret) : HELICS_TIME_MAXTIME;
    }
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
}